

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

void __thiscall backend::codegen::Codegen::translate_inst(Codegen *this,StoreInst *i)

{
  Reg RVar1;
  Inst *pIVar2;
  pointer __p;
  _Head_base<0UL,_arm::LoadStoreInst_*,_false> local_b0;
  anon_class_8_1_a78179b7_conflict9 local_a8;
  _Head_base<0UL,_arm::Inst_*,_false> local_a0;
  _func_int **local_98;
  _Move_ctor_base<false,_arm::RegisterOperand,_short> local_90;
  undefined1 local_78;
  VarId local_70;
  undefined1 local_60 [16];
  variant<arm::RegisterOperand,_short> local_50;
  bool local_38;
  
  RVar1 = translate_value_to_reg(this,&i->val);
  local_70.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
  local_70.id = (i->super_Inst).dest.id;
  translate_var_to_memory_arg((MemoryOperand *)local_60,this,&local_70);
  pIVar2 = (Inst *)operator_new(0x50);
  local_a0._M_head_impl = (Inst *)&PTR_display_001ed7f0;
  local_98 = (_func_int **)local_60._8_8_;
  local_90.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
  super__Variant_storage_alias<arm::RegisterOperand,_short>._M_index =
       local_50.super__Variant_base<arm::RegisterOperand,_short>.
       super__Move_assign_alias<arm::RegisterOperand,_short>.
       super__Copy_assign_alias<arm::RegisterOperand,_short>.
       super__Move_ctor_alias<arm::RegisterOperand,_short>.
       super__Copy_ctor_alias<arm::RegisterOperand,_short>.
       super__Variant_storage_alias<arm::RegisterOperand,_short>._M_index;
  local_a8.__lhs = &local_90;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_std::variant<arm::RegisterOperand,_short>_&&>
    ::_S_vtable._M_arr
    [(long)(char)local_50.super__Variant_base<arm::RegisterOperand,_short>.
                 super__Move_assign_alias<arm::RegisterOperand,_short>.
                 super__Copy_assign_alias<arm::RegisterOperand,_short>.
                 super__Move_ctor_alias<arm::RegisterOperand,_short>.
                 super__Copy_ctor_alias<arm::RegisterOperand,_short>.
                 super__Variant_storage_alias<arm::RegisterOperand,_short>._M_index + 1]._M_data)
            (&local_a8,(variant<arm::RegisterOperand,_short> *)(local_60 + 0x10));
  local_78 = local_38;
  pIVar2->op = StR;
  pIVar2->cond = Always;
  (pIVar2->super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_001ed9b0;
  *(Reg *)&pIVar2[1].super_Displayable._vptr_Displayable = RVar1;
  *(undefined ***)&pIVar2[1].op = &PTR_display_001ed7f0;
  pIVar2[2].super_Displayable._vptr_Displayable = local_98;
  local_a8.__lhs = (_Move_ctor_base<false,_arm::RegisterOperand,_short> *)&pIVar2[2].op;
  *(__index_type *)&pIVar2[3].op =
       local_90.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
       super__Variant_storage_alias<arm::RegisterOperand,_short>._M_index;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<arm::RegisterOperand,_short>_&>
    ::_S_vtable._M_arr
    [(long)(char)local_90.super__Copy_ctor_alias<arm::RegisterOperand,_short>.
                 super__Variant_storage_alias<arm::RegisterOperand,_short>._M_index + 1]._M_data)
            ((anon_class_8_1_a78179b7_conflict10 *)&local_a8,
             (variant<arm::RegisterOperand,_short> *)&local_90);
  *(undefined1 *)&pIVar2[4].super_Displayable._vptr_Displayable = local_78;
  *(undefined1 *)&pIVar2[4].op = B;
  local_b0._M_head_impl = (LoadStoreInst *)0x0;
  local_a0._M_head_impl = pIVar2;
  std::
  vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
  ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
            ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
              *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_a0);
  if (local_a0._M_head_impl != (Inst *)0x0) {
    (*((local_a0._M_head_impl)->super_Displayable)._vptr_Displayable[2])();
  }
  std::unique_ptr<arm::LoadStoreInst,_std::default_delete<arm::LoadStoreInst>_>::~unique_ptr
            ((unique_ptr<arm::LoadStoreInst,_std::default_delete<arm::LoadStoreInst>_> *)&local_b0);
  return;
}

Assistant:

void Codegen::translate_inst(mir::inst::StoreInst& i) {
  auto ins = std::make_unique<LoadStoreInst>(
      arm::OpCode::StR, translate_value_to_reg(i.val),
      translate_var_to_memory_arg(i.dest));
  inst.push_back(std::move(ins));
}